

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::setState(FederateState *this,FederateStates newState)

{
  FederateStates FVar1;
  FederateStates in_SIL;
  FederateStates *in_RDI;
  atomic<helics::FederateStates> *unaff_retaddr;
  FederateStates reqState_1;
  FederateStates reqState;
  FederateStates in_stack_ffffffffffffffdf;
  memory_order in_stack_fffffffffffffff0;
  
  FVar1 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x5a0123);
  if (FVar1 != in_SIL) {
    switch((atomic<helics::FederateStates> *)(ulong)in_SIL) {
    case (atomic<helics::FederateStates> *)0x0:
    case (atomic<helics::FederateStates> *)0x3:
    case (atomic<helics::FederateStates> *)0x4:
    case (atomic<helics::FederateStates> *)0x5:
      std::atomic<helics::FederateStates>::operator=
                ((atomic<helics::FederateStates> *)(ulong)in_SIL,in_stack_ffffffffffffffdf);
      break;
    case (atomic<helics::FederateStates> *)0x1:
      std::atomic<helics::FederateStates>::compare_exchange_strong
                (unaff_retaddr,in_RDI,in_SIL,in_stack_fffffffffffffff0);
      break;
    case (atomic<helics::FederateStates> *)0x2:
      std::atomic<helics::FederateStates>::compare_exchange_strong
                (unaff_retaddr,in_RDI,in_SIL,in_stack_fffffffffffffff0);
      break;
    case (atomic<helics::FederateStates> *)0x6:
    }
  }
  return;
}

Assistant:

void FederateState::setState(FederateStates newState)
{
    if (state == newState) {
        return;
    }
    switch (newState) {
        case FederateStates::ERRORED:
        case FederateStates::FINISHED:
        case FederateStates::CREATED:
        case FederateStates::TERMINATING:
            state = newState;
            break;
        case FederateStates::INITIALIZING: {
            auto reqState = FederateStates::CREATED;
            state.compare_exchange_strong(reqState, newState);
            break;
        }
        case FederateStates::EXECUTING: {
            auto reqState = FederateStates::INITIALIZING;
            state.compare_exchange_strong(reqState, newState);
            break;
        }
        case FederateStates::UNKNOWN:
        default:
            break;
    }
}